

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O2

void __thiscall NodeKey::dump(NodeKey *this)

{
  ostream *poVar1;
  char *pcVar2;
  char *pcVar3;
  
  *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
       *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) &
       0xffffffb5 | 8;
  poVar1 = std::operator<<((ostream *)&std::cout,"Flags: 0x");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Size1: 0x");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Size2: 0x");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Node index: 0x");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Volume index: 0x");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Sector index: 0x");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Has compression: ");
  pcVar3 = "true";
  pcVar2 = "true";
  if ((this->m_flags & 1) == 0) {
    pcVar2 = "false";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Has bit 4: ");
  pcVar2 = "true";
  if ((this->m_flags & 0x10) == 0) {
    pcVar2 = "false";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Has bit 5: ");
  if ((this->m_flags & 0x20) == 0) {
    pcVar3 = "false";
  }
  poVar1 = std::operator<<(poVar1,pcVar3);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  *(uint *)(&poVar1->field_0x18 + (long)poVar1->_vptr_basic_ostream[-3]) =
       *(uint *)(&poVar1->field_0x18 + (long)poVar1->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void NodeKey::dump() const
{
	std::cout
		<< std::hex
		<< "Flags: 0x" << flags() << std::endl
		<< "Size1: 0x" << size1() << std::endl
		<< "Size2: 0x" << size2() << std::endl
		<< "Node index: 0x" << nodeIndex() << std::endl
		<< "Volume index: 0x" << volumeIndex() << std::endl
		<< "Sector index: 0x" << sectorIndex() << std::endl
		<< "Has compression: " << (hasCompression() ? "true" : "false") << std::endl
		<< "Has bit 4: " << (hasBit4() ? "true" : "false") << std::endl
		<< "Has bit 5: " << (hasBit5() ? "true" : "false") << std::endl
		<< std::dec << std::endl;
}